

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O3

void test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>
               (unsigned_long_long num1,_func_int_char_ptr_ptr_double_ptr *read_f,bool is_ok)

{
  mp_type mVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  byte bVar6;
  ulong uVar7;
  char (*pacVar8) [16];
  undefined4 extraout_EDX;
  float fVar9;
  uint extraout_EDX_00;
  undefined7 in_register_00000011;
  double dVar10;
  uint uVar11;
  long lVar12;
  char *unaff_RBP;
  byte *pbVar13;
  char (*mp_nums_00) [16];
  code *pcVar14;
  char *pcVar15;
  char *fmt;
  char cVar16;
  ulong uVar17;
  undefined8 uVar18;
  char *pcVar19;
  undefined *puVar20;
  char *pcVar21;
  bool bVar22;
  char *mp_num_pos2;
  double num2;
  char mp_nums [16] [16];
  char str [256];
  double dStack_950;
  undefined1 *puStack_948;
  char acStack_940 [256];
  undefined1 uStack_840;
  undefined8 uStack_83f;
  undefined1 auStack_837 [255];
  char (*pacStack_738) [16];
  undefined8 uStack_730;
  undefined *puStack_728;
  code *pcStack_720;
  double dStack_718;
  byte *pbStack_710;
  char acStack_708 [256];
  byte abStack_608 [16];
  byte abStack_5f8 [248];
  long lStack_500;
  ulong uStack_4f8;
  char *pcStack_4f0;
  char *pcStack_4e8;
  char *pcStack_4e0;
  code *pcStack_4d8;
  char (*pacStack_4d0) [16];
  char *pcStack_4c8;
  float fStack_4c0;
  undefined4 uStack_4bc;
  double dStack_4b8;
  double dStack_4b0;
  code *pcStack_4a8;
  char acStack_4a0 [256];
  byte bStack_3a0;
  undefined8 uStack_39f;
  char acStack_397 [255];
  long lStack_298;
  ulong uStack_290;
  char *pcStack_288;
  char *pcStack_280;
  char *pcStack_278;
  code *pcStack_270;
  ulong local_268;
  char *local_260;
  float local_258;
  undefined4 local_254;
  double local_250;
  double local_248;
  _func_int_char_ptr_ptr_double_ptr *local_240;
  byte local_238;
  undefined8 local_237;
  char acStack_22f [247];
  char local_138 [256];
  undefined1 local_38 [8];
  
  local_254 = (undefined4)CONCAT71(in_register_00000011,is_ok);
  builtin_strncpy(local_138,"typed read of ",0xf);
  pcStack_270 = (code *)0x138a9a;
  local_240 = read_f;
  iVar2 = snprintf(local_138 + 0xe,0xf2,"%llu",num1);
  pcVar19 = local_138 + (long)iVar2 + 0xe;
  pcStack_270 = (code *)0x138abe;
  iVar2 = snprintf(pcVar19,(size_t)(local_38 + -(long)pcVar19)," into ");
  pcStack_270 = (code *)0x138ad8;
  snprintf(pcVar19 + iVar2,(size_t)(local_38 + -(long)(pcVar19 + iVar2)),"double");
  pcStack_270 = (code *)0x138ae7;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x138b00;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x138b10;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x138b1d;
  fputc(10,_stdout);
  pcStack_270 = (code *)0x138b2a;
  iVar2 = test_encode_uint_all_sizes((char (*) [16])&local_238,num1);
  pacVar8 = (char (*) [16])(&local_238 + (long)iVar2 * 0x10);
  pcStack_270 = (code *)0x138b48;
  local_268 = num1;
  iVar3 = test_encode_int_all_sizes(pacVar8,num1);
  uVar11 = iVar2 + iVar3;
  if (uVar11 != 0 && SCARRY4(iVar2,iVar3) == (int)uVar11 < 0) {
    local_258 = (float)(long)local_268;
    local_250 = (double)(long)local_268;
    uVar17 = (ulong)uVar11;
    pcVar21 = (char *)((long)&local_237 + 1);
    lVar12 = 0;
    do {
      lVar4 = lVar12 * 0x10;
      bVar6 = pcVar21[-2];
      uVar7 = (ulong)bVar6;
      mVar1 = mp_type_hint[uVar7];
      pcVar15 = pcVar21;
      if (mVar1 == MP_UINT) {
        switch(bVar6) {
        case 0xcc:
          uVar7 = (ulong)(byte)pcVar21[-1];
          break;
        case 0xcd:
          uVar7 = (ulong)(ushort)(*(ushort *)(pcVar21 + -1) << 8 | *(ushort *)(pcVar21 + -1) >> 8);
          pcVar15 = acStack_22f + lVar4 + -6;
          break;
        case 0xce:
          uVar11 = *(uint *)(pcVar21 + -1);
          uVar7 = (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                         uVar11 << 0x18);
          pcVar15 = acStack_22f + lVar4 + -4;
          break;
        case 0xcf:
          uVar7 = *(ulong *)(pcVar21 + -1);
          uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                  (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                  (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                  | uVar7 << 0x38;
          pcVar15 = acStack_22f + lVar12 * 0x10;
          break;
        default:
          if ((char)bVar6 < '\0') {
LAB_00138e36:
            pcStack_270 = (code *)0x138e3b;
            test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e3b:
            pcStack_270 = (code *)0x138e40;
            test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e40:
            pcStack_270 = (code *)0x138e5f;
            __assert_fail("c == 0xcb",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x987,"double mp_decode_double(const char **)");
          }
          pcVar15 = acStack_22f + (lVar12 * 2 + -1) * 8;
        }
        if (uVar7 != local_268) {
          pcStack_270 = (code *)0x138e88;
          test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00138e88:
          pcStack_270 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
          test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
          builtin_strncpy(acStack_4a0,"typed read of ",0xf);
          pcStack_4d8 = (code *)0x138ef1;
          uStack_4bc = extraout_EDX;
          pcStack_4a8 = (code *)num1;
          lStack_298 = lVar12;
          uStack_290 = uVar17;
          pcStack_288 = pcVar19;
          pcStack_280 = pcVar15;
          pcStack_278 = pcVar21;
          pcStack_270 = (code *)unaff_RBP;
          iVar2 = snprintf(acStack_4a0 + 0xe,0xf2,"%lld",pacVar8);
          pcVar19 = acStack_4a0 + (long)iVar2 + 0xe;
          pcStack_4d8 = (code *)0x138f12;
          iVar2 = snprintf(pcVar19,(size_t)(&bStack_3a0 + -(long)pcVar19)," into ");
          pcStack_4d8 = (code *)0x138f2c;
          snprintf(pcVar19 + iVar2,(size_t)(&bStack_3a0 + -(long)(pcVar19 + iVar2)),"double");
          pcStack_4d8 = (code *)0x138f3b;
          _space((FILE *)_stdout);
          pcStack_4d8 = (code *)0x138f54;
          fwrite("# ",2,1,_stdout);
          pcStack_4d8 = (code *)0x138f61;
          fputs(acStack_4a0,_stdout);
          pcStack_4d8 = (code *)0x138f6e;
          fputc(10,_stdout);
          mp_nums_00 = (char (*) [16])&bStack_3a0;
          pcStack_4d8 = (code *)0x138f82;
          pacStack_4d0 = pacVar8;
          uVar11 = test_encode_int_all_sizes(mp_nums_00,(int64_t)pacVar8);
          if ((int)uVar11 < 1) {
            return;
          }
          fStack_4c0 = (float)(long)pacStack_4d0;
          dStack_4b8 = (double)(long)pacStack_4d0;
          uVar17 = (ulong)uVar11;
          pcVar21 = (char *)((long)&uStack_39f + 1);
          lVar12 = 0;
          goto LAB_00138fb4;
        }
      }
      else if (mVar1 == MP_FLOAT) {
        if (bVar6 != 0xca) {
LAB_00138e64:
          pcStack_270 = (code *)0x138e83;
          __assert_fail("c == 0xca",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x97e,"float mp_decode_float(const char **)");
        }
        uVar11 = *(uint *)(pcVar21 + -1);
        fVar9 = (float)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                       uVar11 << 0x18);
        if ((fVar9 != local_258) || (NAN(fVar9) || NAN(local_258))) goto LAB_00138e3b;
        pcVar15 = pcVar21 + 3;
      }
      else if (mVar1 == MP_INT) {
        uVar7 = (ulong)(char)bVar6;
        switch(bVar6) {
        case 0xd0:
          uVar7 = (ulong)pcVar21[-1];
          num1 = (unsigned_long_long)&switchD_00138bcc::switchdataD_00140e1c;
          break;
        case 0xd1:
          uVar7 = (ulong)(short)(*(ushort *)(pcVar21 + -1) << 8 | *(ushort *)(pcVar21 + -1) >> 8);
          num1 = (unsigned_long_long)&switchD_00138bcc::switchdataD_00140e1c;
          pcVar15 = acStack_22f + lVar4 + -6;
          break;
        case 0xd2:
          uVar11 = *(uint *)(pcVar21 + -1);
          uVar7 = (ulong)(int)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                              uVar11 << 0x18);
          num1 = (unsigned_long_long)&switchD_00138bcc::switchdataD_00140e1c;
          pcVar15 = acStack_22f + lVar4 + -4;
          break;
        case 0xd3:
          uVar7 = *(ulong *)(pcVar21 + -1);
          uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                  (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                  (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                  | uVar7 << 0x38;
          num1 = (unsigned_long_long)&switchD_00138bcc::switchdataD_00140e1c;
          pcVar15 = acStack_22f + lVar12 * 0x10;
          break;
        default:
          if (bVar6 < 0xe0) {
            pcStack_270 = (code *)0x138e36;
            test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
            goto LAB_00138e36;
          }
          pcVar15 = acStack_22f + (lVar12 * 2 + -1) * 8;
        }
        if (uVar7 != local_268) goto LAB_00138e88;
      }
      else {
        if (bVar6 != 0xcb) goto LAB_00138e40;
        uVar7 = *(ulong *)(pcVar21 + -1);
        dVar10 = (double)(uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                          (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                          (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                          (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38);
        if ((dVar10 != local_250) || (NAN(dVar10) || NAN(local_250))) {
          pcStack_270 = (code *)0x138e64;
          test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
          goto LAB_00138e64;
        }
        pcVar15 = acStack_22f + lVar12 * 0x10;
      }
      unaff_RBP = pcVar21 + -2;
      pcVar19 = (char *)(ulong)(uint)(int)(char)bVar6;
      local_248 = 0.0;
      pcStack_270 = (code *)0x138d17;
      local_260 = unaff_RBP;
      iVar2 = (*local_240)(&local_260,&local_248);
      if ((char)local_254 == '\0') {
        pcStack_270 = (code *)0x138de7;
        _ok((uint)(iVar2 == -1),"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",pcVar19);
        bVar22 = unaff_RBP == local_260;
        iVar2 = 0x738;
        pcVar15 = "check position";
        num1 = (unsigned_long_long)"mp_num_pos2 == mp_nums[i]";
      }
      else {
        unaff_RBP = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_270 = (code *)0x138d51;
        _ok((uint)(iVar2 == 0),"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X",pcVar19);
        pcStack_270 = (code *)0x138d79;
        _ok((uint)(pcVar15 == local_260),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        bVar22 = ABS(local_250 - local_248) < 1e-15;
        iVar2 = 0x73e;
        pcVar15 = "check float number";
        num1 = (unsigned_long_long)"double_eq(num1, num2)";
      }
      pacVar8 = (char (*) [16])(ulong)bVar22;
      pcStack_270 = (code *)0x138e0f;
      _ok((uint)bVar22,(char *)num1,
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          iVar2,pcVar15);
      lVar12 = lVar12 + 1;
      pcVar21 = pcVar21 + 0x10;
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  return;
LAB_00138fb4:
  lVar4 = lVar12 * 0x10;
  bVar6 = pcVar21[-2];
  pacVar8 = (char (*) [16])(ulong)bVar6;
  mVar1 = mp_type_hint[(long)pacVar8];
  pcVar15 = pcVar21;
  if (mVar1 == MP_UINT) {
    switch(bVar6) {
    case 0xcc:
      pacVar8 = (char (*) [16])(ulong)(byte)pcVar21[-1];
      break;
    case 0xcd:
      pacVar8 = (char (*) [16])
                (ulong)(ushort)(*(ushort *)(pcVar21 + -1) << 8 | *(ushort *)(pcVar21 + -1) >> 8);
      pcVar15 = acStack_397 + lVar4 + -6;
      break;
    case 0xce:
      uVar11 = *(uint *)(pcVar21 + -1);
      pacVar8 = (char (*) [16])
                (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                       uVar11 << 0x18);
      pcVar15 = acStack_397 + lVar4 + -4;
      break;
    case 0xcf:
      uVar7 = *(ulong *)(pcVar21 + -1);
      pacVar8 = (char (*) [16])
                (uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                 (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                 (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28 |
                uVar7 << 0x38);
      pcVar15 = acStack_397 + lVar12 * 0x10;
      break;
    default:
      if ((char)bVar6 < '\0') {
LAB_00139276:
        pcStack_4d8 = (code *)0x13927b;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_0013927b:
        pcStack_4d8 = (code *)0x139280;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00139280:
        pcStack_4d8 = (code *)0x13929f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar15 = acStack_397 + (lVar12 * 2 + -1) * 8;
    }
    if (pacVar8 != pacStack_4d0) {
      pcStack_4d8 = (code *)0x1392c8;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_001392c8:
      pcStack_4d8 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_708,"typed read of ",0xf);
      uVar18 = CONCAT71((int7)(uVar17 >> 8),1);
      pcStack_720 = (code *)0x13932e;
      lStack_500 = lVar12;
      uStack_4f8 = uVar17;
      pcStack_4f0 = pcVar19;
      pcStack_4e8 = pcVar15;
      pcStack_4e0 = pcVar21;
      pcStack_4d8 = (code *)unaff_RBP;
      iVar2 = snprintf(acStack_708 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar19 = acStack_708 + (long)iVar2 + 0xe;
      pcStack_720 = (code *)0x13934f;
      iVar2 = snprintf(pcVar19,(size_t)(abStack_608 + -(long)pcVar19)," into ");
      pcStack_720 = (code *)0x139369;
      snprintf(pcVar19 + iVar2,(size_t)(abStack_608 + -(long)(pcVar19 + iVar2)),"double");
      puVar20 = &stdout;
      pcStack_720 = (code *)0x139378;
      _space((FILE *)_stdout);
      pcStack_720 = (code *)0x139391;
      fwrite("# ",2,1,_stdout);
      pcStack_720 = (code *)0x13939e;
      fputs(acStack_708,_stdout);
      pcVar14 = (code *)0xa;
      pcStack_720 = (code *)0x1393ab;
      fputc(10,_stdout);
      abStack_608[0] = 0xca;
      abStack_608[1] = 0x4a;
      abStack_608[2] = 200;
      abStack_608[3] = 0x59;
      abStack_608[4] = 0x10;
      abStack_5f8[0] = 0xcb;
      abStack_5f8[1] = 0x41;
      abStack_5f8[2] = 0x59;
      abStack_5f8[3] = 0xb;
      abStack_5f8[4] = 0x22;
      abStack_5f8[5] = 0;
      abStack_5f8[6] = 0;
      abStack_5f8[7] = 0;
      abStack_5f8[8] = 0;
      pbVar5 = abStack_608;
      goto LAB_001393db;
    }
  }
  else if (mVar1 == MP_FLOAT) {
    if (bVar6 != 0xca) {
LAB_001392a4:
      pcStack_4d8 = (code *)0x1392c3;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar11 = *(uint *)(pcVar21 + -1);
    fVar9 = (float)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18);
    if ((fVar9 != fStack_4c0) || (NAN(fVar9) || NAN(fStack_4c0))) goto LAB_0013927b;
    pcVar15 = pcVar21 + 3;
  }
  else if (mVar1 == MP_INT) {
    pacVar8 = (char (*) [16])(long)(char)bVar6;
    switch(bVar6) {
    case 0xd0:
      pacVar8 = (char (*) [16])(long)pcVar21[-1];
      break;
    case 0xd1:
      pacVar8 = (char (*) [16])
                (long)(short)(*(ushort *)(pcVar21 + -1) << 8 | *(ushort *)(pcVar21 + -1) >> 8);
      pcVar15 = acStack_397 + lVar4 + -6;
      break;
    case 0xd2:
      uVar11 = *(uint *)(pcVar21 + -1);
      pacVar8 = (char (*) [16])
                (long)(int)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                           uVar11 << 0x18);
      pcVar15 = acStack_397 + lVar4 + -4;
      break;
    case 0xd3:
      uVar7 = *(ulong *)(pcVar21 + -1);
      pacVar8 = (char (*) [16])
                (uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                 (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                 (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28 |
                uVar7 << 0x38);
      pcVar15 = acStack_397 + lVar12 * 0x10;
      break;
    default:
      if (bVar6 < 0xe0) {
        pcStack_4d8 = (code *)0x139276;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00139276;
      }
      pcVar15 = acStack_397 + (lVar12 * 2 + -1) * 8;
    }
    if (pacVar8 != pacStack_4d0) goto LAB_001392c8;
  }
  else {
    if (bVar6 != 0xcb) goto LAB_00139280;
    uVar7 = *(ulong *)(pcVar21 + -1);
    dVar10 = (double)(uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38);
    if ((dVar10 != dStack_4b8) || (NAN(dVar10) || NAN(dStack_4b8))) {
      pcStack_4d8 = (code *)0x1392a4;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_001392a4;
    }
    pcVar15 = acStack_397 + lVar12 * 0x10;
  }
  unaff_RBP = pcVar21 + -2;
  pcVar19 = (char *)(ulong)(uint)(int)(char)bVar6;
  dStack_4b0 = 0.0;
  pcStack_4d8 = (code *)0x139157;
  pcStack_4c8 = unaff_RBP;
  iVar2 = (*pcStack_4a8)(&pcStack_4c8,&dStack_4b0);
  if ((char)uStack_4bc == '\0') {
    pcStack_4d8 = (code *)0x139227;
    _ok((uint)(iVar2 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar19);
    bVar22 = unaff_RBP == pcStack_4c8;
    pcVar15 = "mp_num_pos2 == mp_nums[i]";
    iVar2 = 0x738;
    fmt = "check position";
  }
  else {
    unaff_RBP = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_4d8 = (code *)0x139191;
    _ok((uint)(iVar2 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar19);
    pcStack_4d8 = (code *)0x1391b9;
    _ok((uint)(pcVar15 == pcStack_4c8),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar22 = ABS(dStack_4b8 - dStack_4b0) < 1e-15;
    pcVar15 = "double_eq(num1, num2)";
    iVar2 = 0x73e;
    fmt = "check float number";
  }
  mp_nums_00 = (char (*) [16])(ulong)bVar22;
  pcStack_4d8 = (code *)0x13924f;
  _ok((uint)bVar22,pcVar15,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar2,
      fmt);
  lVar12 = lVar12 + 1;
  pcVar21 = pcVar21 + 0x10;
  uVar17 = uVar17 - 1;
  if (uVar17 == 0) {
    return;
  }
  goto LAB_00138fb4;
LAB_001393db:
  bVar6 = *pbVar5;
  uVar17 = (ulong)bVar6;
  mVar1 = mp_type_hint[uVar17];
  if (mVar1 == MP_UINT) {
    if (bVar6 == 0xce) {
      uVar11 = *(uint *)(pbVar5 + 1);
      uVar7 = (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                     uVar11 << 0x18);
      pbVar13 = pbVar5 + 5;
LAB_001394a6:
      if (uVar7 == 0x642c88) goto LAB_001394cd;
    }
    else {
      if (bVar6 == 0xcf) {
        uVar7 = *(ulong *)(pbVar5 + 1);
        uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28 |
                uVar7 << 0x38;
        pbVar13 = pbVar5 + 9;
        goto LAB_001394a6;
      }
      if ((1 < bVar6 - 0xcc) && ((char)bVar6 < '\0')) {
        pcStack_720 = (code *)0x139617;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00139617;
      }
    }
    pcStack_720 = (code *)0x1395b5;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    bVar6 = (byte)uVar17;
    uVar11 = extraout_EDX_00;
LAB_001395b5:
    if ((1 < uVar11 - 0xd0) && (bVar6 < 0xe0)) {
LAB_00139617:
      pcStack_720 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_940,"typed read of ",0xf);
      pacStack_738 = mp_nums_00;
      uStack_730 = uVar18;
      puStack_728 = puVar20;
      pcStack_720 = (code *)abStack_5f8;
      iVar2 = snprintf(acStack_940 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar19 = acStack_940 + (long)iVar2 + 0xe;
      iVar2 = snprintf(pcVar19,(size_t)(&uStack_840 + -(long)pcVar19)," into ");
      snprintf(pcVar19 + iVar2,(size_t)(&uStack_840 + -(long)(pcVar19 + iVar2)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_940,_stdout);
      fputc(10,_stdout);
      puStack_948 = &uStack_840;
      uStack_840 = 0xcb;
      uStack_83f = 0xb81e85eb513816c0;
      dStack_950 = 0.0;
      iVar2 = (*pcVar14)(&puStack_948,&dStack_950);
      _ok((uint)(iVar2 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_837 == puStack_948),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_950) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
LAB_001395c5:
    pcStack_720 = (code *)0x1395ca;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395ca:
    pcStack_720 = (code *)0x1395cf;
    test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_001395cf:
    pcStack_720 = (code *)0x1395ee;
    __assert_fail("c == 0xcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x987,"double mp_decode_double(const char **)");
  }
  if (mVar1 == MP_FLOAT) {
    if (bVar6 != 0xca) {
LAB_001395f3:
      pcStack_720 = (code *)0x139612;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar11 = *(uint *)(pbVar5 + 1);
    fVar9 = (float)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18);
    if ((fVar9 == 6.565e+06) && (!NAN(fVar9))) {
      pbVar13 = pbVar5 + 5;
      goto LAB_001394cd;
    }
    goto LAB_001395ca;
  }
  if (mVar1 == MP_INT) {
    if (bVar6 != 0xd2) {
      uVar11 = (uint)bVar6;
      if (bVar6 == 0xd3) {
        uVar17 = *(ulong *)(pbVar5 + 1);
        uVar17 = uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                 (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                 (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                 (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38;
        pbVar13 = pbVar5 + 9;
        goto LAB_001394c0;
      }
      goto LAB_001395b5;
    }
    uVar11 = *(uint *)(pbVar5 + 1);
    pbVar13 = pbVar5 + 5;
    uVar17 = (ulong)(int)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                         uVar11 << 0x18);
LAB_001394c0:
    if (uVar17 == 0x642c88) goto LAB_001394cd;
    goto LAB_001395c5;
  }
  if (bVar6 != 0xcb) goto LAB_001395cf;
  uVar17 = *(ulong *)(pbVar5 + 1);
  dVar10 = (double)(uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                    (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                    (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                    (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38);
  if ((dVar10 != 6565000.0) || (NAN(dVar10))) {
    pcStack_720 = (code *)0x1395f3;
    test_read_num<double,float,int(*)(char_const**,double*)>();
    goto LAB_001395f3;
  }
  pbVar13 = pbVar5 + 9;
LAB_001394cd:
  puVar20 = (undefined *)(ulong)(uint)(int)(char)bVar6;
  dStack_718 = 0.0;
  pcStack_720 = (code *)0x1394e8;
  pbStack_710 = pbVar5;
  iVar2 = (*(code *)mp_nums_00)(&pbStack_710,&dStack_718);
  pcStack_720 = (code *)0x139510;
  _ok((uint)(iVar2 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar20);
  pcStack_720 = (code *)0x139538;
  _ok((uint)(pbVar13 == pbStack_710),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar22 = ABS(6565000.0 - dStack_718) < 1e-15;
  pcVar14 = (code *)(ulong)bVar22;
  pcStack_720 = (code *)0x13957c;
  _ok((uint)bVar22,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  cVar16 = (char)uVar18;
  uVar18 = 0;
  pbVar5 = abStack_5f8;
  if (cVar16 == '\0') {
    return;
  }
  goto LAB_001393db;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}